

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_compiler.c
# Opt level: O0

_Bool gravity_compiler_serialize_infile
                (gravity_compiler_t *compiler,gravity_closure_t *closure,char *path)

{
  json_t *json_00;
  json_t *json;
  char *path_local;
  gravity_closure_t *closure_local;
  gravity_compiler_t *compiler_local;
  
  if (closure == (gravity_closure_t *)0x0) {
    compiler_local._7_1_ = false;
  }
  else {
    json_00 = gravity_compiler_serialize(compiler,closure);
    if (json_00 == (json_t *)0x0) {
      compiler_local._7_1_ = false;
    }
    else {
      json_write_file(json_00,path);
      json_free(json_00);
      compiler_local._7_1_ = true;
    }
  }
  return compiler_local._7_1_;
}

Assistant:

bool gravity_compiler_serialize_infile (gravity_compiler_t *compiler, gravity_closure_t *closure, const char *path) {
    if (!closure) return false;
    json_t *json = gravity_compiler_serialize(compiler, closure);
    if (!json) return false;
    
    json_write_file(json, path);
    json_free(json);
    return true;
}